

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O1

void __thiscall editions_unittest::TestDelimited::Clear(TestDelimited *this)

{
  uint uVar1;
  TestDelimited_LengthPrefixed *this_00;
  TestDelimited *this_01;
  TestDelimited_GroupLike *pTVar2;
  NotGroupLikeScope *this_02;
  MessageImport *this_03;
  Nonnull<const_char_*> failure_msg;
  int line;
  LogMessageFatal local_20;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      this_00 = (this->field_0)._impl_.lengthprefixed_;
      if (this_00 == (TestDelimited_LengthPrefixed *)0x0) {
        failure_msg = "_impl_.lengthprefixed_ != nullptr";
        line = 0x774;
        goto LAB_00cfa67a;
      }
      TestDelimited_LengthPrefixed::Clear(this_00);
    }
    if ((uVar1 & 2) != 0) {
      this_01 = (this->field_0)._impl_.nested_;
      if (this_01 == (TestDelimited *)0x0) {
        failure_msg = "_impl_.nested_ != nullptr";
        line = 0x778;
        goto LAB_00cfa67a;
      }
      Clear(this_01);
    }
    if ((uVar1 & 4) != 0) {
      pTVar2 = (this->field_0)._impl_.grouplike_;
      if (pTVar2 == (TestDelimited_GroupLike *)0x0) {
        failure_msg = "_impl_.grouplike_ != nullptr";
        line = 0x77c;
        goto LAB_00cfa67a;
      }
      TestDelimited_GroupLike::Clear(pTVar2);
    }
    if ((uVar1 & 8) != 0) {
      pTVar2 = (this->field_0)._impl_.notgrouplike_;
      if (pTVar2 == (TestDelimited_GroupLike *)0x0) {
        failure_msg = "_impl_.notgrouplike_ != nullptr";
        line = 0x780;
        goto LAB_00cfa67a;
      }
      TestDelimited_GroupLike::Clear(pTVar2);
    }
    if ((uVar1 & 0x10) != 0) {
      this_02 = (this->field_0)._impl_.notgrouplikescope_;
      if (this_02 == (NotGroupLikeScope *)0x0) {
        failure_msg = "_impl_.notgrouplikescope_ != nullptr";
        line = 0x784;
        goto LAB_00cfa67a;
      }
      NotGroupLikeScope::Clear(this_02);
    }
    if ((uVar1 & 0x20) != 0) {
      this_03 = (this->field_0)._impl_.messageimport_;
      if (this_03 == (MessageImport *)0x0) {
        failure_msg = "_impl_.messageimport_ != nullptr";
        line = 0x788;
LAB_00cfa67a:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_delimited.pb.cc"
                   ,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      MessageImport::Clear(this_03);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestDelimited::Clear() {
// @@protoc_insertion_point(message_clear_start:editions_unittest.TestDelimited)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.lengthprefixed_ != nullptr);
      _impl_.lengthprefixed_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.nested_ != nullptr);
      _impl_.nested_->Clear();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.grouplike_ != nullptr);
      _impl_.grouplike_->Clear();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.notgrouplike_ != nullptr);
      _impl_.notgrouplike_->Clear();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.notgrouplikescope_ != nullptr);
      _impl_.notgrouplikescope_->Clear();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(_impl_.messageimport_ != nullptr);
      _impl_.messageimport_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}